

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemReadIOCallback.cpp
# Opt level: O0

ssize_t __thiscall
libebml::MemReadIOCallback::read(MemReadIOCallback *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  size_t RemainingBytes;
  size_t Size_local;
  void *Buffer_local;
  MemReadIOCallback *this_local;
  
  RemainingBytes = (size_t)__buf;
  if (this->mEnd + -(long)this->mPtr < __buf) {
    RemainingBytes = (size_t)(this->mEnd + -(long)this->mPtr);
  }
  memcpy((void *)CONCAT44(in_register_00000034,__fd),this->mPtr,RemainingBytes);
  this->mPtr = this->mPtr + RemainingBytes;
  return RemainingBytes;
}

Assistant:

uint32
MemReadIOCallback::read(void *Buffer,
                        size_t Size) {
  size_t RemainingBytes = mEnd - mPtr;
  if (RemainingBytes < Size)
    Size = RemainingBytes;

  std::memcpy(Buffer, mPtr, Size);
  mPtr += Size;

  return Size;
}